

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O3

void __thiscall google::protobuf::io::Tokenizer::ConsumeString(Tokenizer *this,char delimiter)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  long *local_50 [2];
  long local_40 [2];
  
LAB_00321ace:
  do {
    while (cVar1 = this->current_char_, cVar1 == '\n') {
      if (this->allow_multiline_strings_ == false) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"String literals cannot cross line boundaries.","");
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   local_50);
LAB_00321f3f:
        if (local_50[0] == local_40) {
          return;
        }
        operator_delete(local_50[0],local_40[0] + 1);
        return;
      }
LAB_00321bd9:
      NextChar(this);
    }
    if (cVar1 == '\\') {
      NextChar(this);
      bVar2 = this->current_char_;
      if ((((bVar2 - 0x61 < 0x16) && ((0x2a2023U >> (bVar2 - 0x61 & 0x1f) & 1) != 0)) ||
          ((bVar2 - 0x22 < 0x3b && ((0x400000020000021U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) != 0)
           ))) || ((bVar2 & 0xf8) == 0x30)) goto LAB_00321bd9;
      if (bVar2 == 0x55) {
        NextChar(this);
        if (((this->current_char_ == '0') && (NextChar(this), this->current_char_ == '0')) &&
           (NextChar(this), (this->current_char_ & 0xfeU) == 0x30)) {
          NextChar(this);
          if (((byte)(this->current_char_ - 0x30U) < 10) ||
             ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
              ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
            NextChar(this);
            if (((byte)(this->current_char_ - 0x30U) < 10) ||
               ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
              NextChar(this);
              if (((byte)(this->current_char_ - 0x30U) < 10) ||
                 ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
                NextChar(this);
                if (((byte)(this->current_char_ - 0x30U) < 10) ||
                   ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
                    ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
                  NextChar(this);
                  if (((byte)(this->current_char_ - 0x30U) < 10) ||
                     ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
                      ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) goto LAB_00321bd9;
                }
              }
            }
          }
        }
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,
                   "Expected eight hex digits up to 10ffff for \\U escape sequence","");
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   (string *)local_50);
      }
      else if (bVar2 == 0x75) {
        NextChar(this);
        if (((byte)(this->current_char_ - 0x30U) < 10) ||
           ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
          NextChar(this);
          if (((byte)(this->current_char_ - 0x30U) < 10) ||
             ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
              ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
            NextChar(this);
            if (((byte)(this->current_char_ - 0x30U) < 10) ||
               ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) {
              NextChar(this);
              if (((byte)(this->current_char_ - 0x30U) < 10) ||
                 ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) goto LAB_00321bd9;
            }
          }
        }
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Expected four hex digits for \\u escape sequence.","");
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   (string *)local_50);
      }
      else if (bVar2 == 0x78) {
        NextChar(this);
        if (((byte)(this->current_char_ - 0x30U) < 10) ||
           ((uVar3 = (byte)this->current_char_ - 0x41, uVar3 < 0x26 &&
            ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)))) goto LAB_00321bd9;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Expected hex digits for escape sequence.","");
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   (string *)local_50);
      }
      else {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Invalid escape sequence in string literal.","");
        (*this->error_collector_->_vptr_ErrorCollector[2])
                  (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,
                   (string *)local_50);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      goto LAB_00321ace;
    }
    if (cVar1 == '\0') {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Unexpected end of string.","");
      (*this->error_collector_->_vptr_ErrorCollector[2])
                (this->error_collector_,(ulong)(uint)this->line_,(ulong)(uint)this->column_,local_50
                );
      goto LAB_00321f3f;
    }
    NextChar(this);
    if (cVar1 == delimiter) {
      return;
    }
  } while( true );
}

Assistant:

void Tokenizer::ConsumeString(char delimiter) {
  while (true) {
    switch (current_char_) {
      case '\0':
        AddError("Unexpected end of string.");
        return;

      case '\n': {
        if (!allow_multiline_strings_) {
          AddError("String literals cannot cross line boundaries.");
          return;
        }
        NextChar();
        break;
      }

      case '\\': {
        // An escape sequence.
        NextChar();
        if (TryConsumeOne<Escape>()) {
          // Valid escape sequence.
        } else if (TryConsumeOne<OctalDigit>()) {
          // Possibly followed by two more octal digits, but these will
          // just be consumed by the main loop anyway so we don't need
          // to do so explicitly here.
        } else if (TryConsume('x')) {
          if (!TryConsumeOne<HexDigit>()) {
            AddError("Expected hex digits for escape sequence.");
          }
          // Possibly followed by another hex digit, but again we don't care.
        } else if (TryConsume('u')) {
          if (!TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>()) {
            AddError("Expected four hex digits for \\u escape sequence.");
          }
        } else if (TryConsume('U')) {
          // We expect 8 hex digits; but only the range up to 0x10ffff is
          // legal.
          if (!TryConsume('0') ||
              !TryConsume('0') ||
              !(TryConsume('0') || TryConsume('1')) ||
              !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>() ||
              !TryConsumeOne<HexDigit>()) {
            AddError("Expected eight hex digits up to 10ffff for \\U escape "
                     "sequence");
          }
        } else {
          AddError("Invalid escape sequence in string literal.");
        }
        break;
      }

      default: {
        if (current_char_ == delimiter) {
          NextChar();
          return;
        }
        NextChar();
        break;
      }
    }
  }
}